

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O2

void sysbvm_jit_x86_mov64IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               sysbvm_x86_register_t source)

{
  undefined5 uVar1;
  sysbvm_x86_register_t sVar2;
  undefined8 in_RAX;
  byte bVar3;
  uint8_t uVar5;
  uint8_t uVar6;
  byte bVar7;
  size_t sStack_10;
  uint8_t instruction [8];
  uint8_t uVar4;
  
  sVar2 = destination & SYSBVM_X86_64_ARG0;
  uVar6 = (uint8_t)((uint)offset >> 8);
  bVar3 = (byte)source;
  bVar7 = (byte)destination;
  uVar5 = (uint8_t)((uint)offset >> 0x18);
  uVar4 = (uint8_t)((uint)offset >> 0x10);
  instruction._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  uVar1 = instruction._3_5_;
  instruction._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  if (offset == 0) {
    if (sVar2 != SYSBVM_X86_EBP) {
      if (sVar2 == SYSBVM_X86_ESP) {
        instruction[2] = (bVar7 & 7) + 0x20;
        instruction[0] = 'H';
        instruction[1] = 0x89;
        instruction[3] = (bVar3 & 7) << 3 | bVar7 & 7;
        sStack_10 = 4;
      }
      else {
        instruction[2] = (bVar3 & 7) << 3 | bVar7 & 7;
        instruction[0] = 'H';
        instruction[1] = 0x89;
        instruction = (uint8_t  [8])CONCAT53(uVar1,instruction._0_3_);
        sStack_10 = 3;
      }
      goto LAB_0014be7b;
    }
  }
  else if (sVar2 == SYSBVM_X86_ESP) {
    instruction._0_3_ = CONCAT12((bVar3 & 7) << 3,0x8948) | 0x840000;
    instruction[3] = '$';
    instruction[4] = (uint8_t)offset;
    instruction[5] = uVar6;
    instruction[6] = uVar4;
    instruction[7] = uVar5;
    sStack_10 = 8;
    goto LAB_0014be7b;
  }
  instruction[7] = (uint8_t)((ulong)in_RAX >> 0x38);
  instruction = (uint8_t  [8])
                (CONCAT17(instruction[7],
                          CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar6,CONCAT13((uint8_t)offset,
                                                                                CONCAT12((bVar3 & 7)
                                                                                         << 3 | 
                                                  bVar7 & 7,0x8948)))))) | 0x800000);
  sStack_10 = 7;
LAB_0014be7b:
  sysbvm_bytecodeJit_addBytes(jit,sStack_10,instruction);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, sysbvm_x86_register_t source)
{
    if(offset == 0 && (destination & SYSBVM_X86_REG_HALF_MASK) != SYSBVM_X86_RBP)
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_sibOnlyBase(destination),
                sysbvm_jit_x86_modRM(destination, source, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);            
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);            
        }
    }
    else
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 2),
                sysbvm_jit_x86_sibOnlyBase(destination),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}